

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O0

void __thiscall
QRhiTextureUploadEntry::QRhiTextureUploadEntry
          (QRhiTextureUploadEntry *this,int layer,int level,
          QRhiTextureSubresourceUploadDescription *desc)

{
  QRhiTextureSubresourceUploadDescription *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  
  *in_RDI = in_ESI;
  in_RDI[1] = in_EDX;
  QRhiTextureSubresourceUploadDescription::QRhiTextureSubresourceUploadDescription
            ((QRhiTextureSubresourceUploadDescription *)CONCAT44(in_ESI,in_EDX),in_RCX);
  return;
}

Assistant:

QRhiTextureUploadEntry::QRhiTextureUploadEntry(int layer, int level,
                                               const QRhiTextureSubresourceUploadDescription &desc)
    : m_layer(layer),
      m_level(level),
      m_desc(desc)
{
}